

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O2

uint toi(void *p,int n)

{
  byte bVar1;
  uint uVar2;
  
  bVar1 = *p;
  uVar2 = (uint)bVar1;
  if (1 < n) {
    uVar2 = toi((void *)((long)p + 1),n + -1);
    uVar2 = (uint)bVar1 | uVar2 << 8;
  }
  return uVar2;
}

Assistant:

static unsigned int
toi(const void *p, int n)
{
	const unsigned char *v = (const unsigned char *)p;
	if (n > 1)
		return v[0] + 256 * toi(v + 1, n - 1);
	if (n == 1)
		return v[0];
	return (0);
}